

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::Passed(UnitTestImpl *this)

{
  bool bVar1;
  
  bVar1 = Failed(this);
  return !bVar1;
}

Assistant:

bool Passed() const { return !Failed(); }